

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::BuildEngineTest_discoveredDependencies_Test::TestBody()::
TaskWithDiscoveredDependency::inputsAvailable(llbuild::core::TaskInterface_
          (void *this,TaskInterface ti)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  value_type_conflict2 *__val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  KeyType local_58;
  TaskInterface local_30;
  
  local_30.ctx = ti.ctx;
  local_30.impl = ti.impl;
  paVar1 = &local_58.key.field_2;
  local_58.key._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"value-B","");
  llbuild::core::TaskInterface::discoveredDependency(&local_30,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.key._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.key._M_dataplus._M_p,local_58.key.field_2._M_allocated_capacity + 1);
  }
  iVar2 = *(int *)((long)this + 0x10) * **(int **)((long)this + 8) * 5;
  local_58.key._M_dataplus._M_p = (pointer)0x0;
  local_58.key._M_string_length = 0;
  local_58.key.field_2._M_allocated_capacity = 0;
  local_58.key._M_dataplus._M_p = (pointer)operator_new(4);
  local_58.key._M_string_length = (size_type)(local_58.key._M_dataplus._M_p + 4);
  local_58.key._M_dataplus._M_p[0] = '\0';
  local_58.key._M_dataplus._M_p[1] = '\0';
  local_58.key._M_dataplus._M_p[2] = '\0';
  local_58.key._M_dataplus._M_p[3] = '\0';
  *local_58.key._M_dataplus._M_p = (char)iVar2;
  local_58.key._M_dataplus._M_p[1] = (char)((uint)iVar2 >> 8);
  local_58.key._M_dataplus._M_p[2] = (char)((uint)iVar2 >> 0x10);
  local_58.key._M_dataplus._M_p[3] = (char)((uint)iVar2 >> 0x18);
  local_58.key.field_2._M_allocated_capacity = local_58.key._M_string_length;
  llbuild::core::TaskInterface::complete(&local_30,(ValueType *)&local_58,false);
  if (local_58.key._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_58.key._M_dataplus._M_p,
                    local_58.key.field_2._M_allocated_capacity - (long)local_58.key._M_dataplus._M_p
                   );
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      // Report the discovered dependency.
      ti.discoveredDependency("value-B");
      ti.complete(intToValue(computedInputValue * valueB * 5));
    }